

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O3

void __thiscall Triangle::prepare_coords(Triangle *this)

{
  undefined1 *v0;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar6;
  int i;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f norm;
  Vector3f v2;
  Vector3f v1;
  float local_b8;
  Vector3f local_a8;
  Vector3f local_9c;
  Vector3f local_90;
  Vector3f local_84;
  Matrix3f local_78;
  Matrix3f local_54;
  
  if (this->has_uv != false) {
    return;
  }
  Vector3f::Vector3f(&local_90,0.0);
  Vector3f::Vector3f(&local_9c,0.0);
  Vector3f::operator=(&this->o,&Vector3f::ZERO);
  v0 = &this->field_0x5c;
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x68);
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x74);
  Vector3f::cross((Vector3f *)&local_78,&local_84);
  Vector3f::normalized((Vector3f *)&local_54);
  fVar8 = Vector3f::dot((Vector3f *)v0,&local_a8);
  i = 0;
  pfVar6 = Vector3f::operator[](&local_a8,0);
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar6),auVar7);
  pfVar6 = Vector3f::operator[](&local_a8,1);
  local_b8 = auVar7._0_4_;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar6),auVar2);
  if (auVar7._0_4_ < local_b8) {
    pfVar6 = Vector3f::operator[](&local_a8,0);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx(ZEXT416((uint)*pfVar6),auVar9);
    pfVar6 = Vector3f::operator[](&local_a8,2);
    local_b8 = auVar7._0_4_;
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar6),auVar3);
    if (auVar7._0_4_ < local_b8) goto LAB_001be581;
  }
  i = 1;
  pfVar6 = Vector3f::operator[](&local_a8,1);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(ZEXT416((uint)*pfVar6),auVar10);
  pfVar6 = Vector3f::operator[](&local_a8,0);
  local_b8 = auVar7._0_4_;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar6),auVar4);
  if (auVar7._0_4_ < local_b8) {
    pfVar6 = Vector3f::operator[](&local_a8,1);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx(ZEXT416((uint)*pfVar6),auVar11);
    pfVar6 = Vector3f::operator[](&local_a8,2);
    local_b8 = auVar7._0_4_;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar6),auVar5);
    if (auVar7._0_4_ < local_b8) goto LAB_001be581;
  }
  i = 2;
LAB_001be581:
  pfVar6 = Vector3f::operator[](&local_a8,i);
  fVar1 = *pfVar6;
  pfVar6 = Vector3f::operator[](&this->o,i);
  *pfVar6 = fVar8 / fVar1;
  createCoordinateSystem(&local_a8,&local_90,&local_9c);
  Matrix3f::Matrix3f(&local_78,&local_a8,&local_90,&local_9c,true);
  Matrix3f::inverse(&local_54,&local_78,(bool *)0x0,0.0);
  Matrix3f::operator=(&this->matrix,&local_54);
  return;
}

Assistant:

void prepare_coords() {
		if (has_uv) return;
		Vector3f v1, v2;
		o = Vector3f::ZERO;
		Vector3f norm = Vector3f::cross(v[0] - v[1], v[0] - v[2]).normalized();
		float C = Vector3f::dot(v[0], norm);
		if (fabs(norm[0]) > fabs(norm[1]) && fabs(norm[0])>fabs(norm[2])) o[0] = C / norm[0];
		else if (fabs(norm[1]) > fabs(norm[0])&&fabs(norm[1])>fabs(norm[2])) o[1] = C / norm[1];
		else o[2] = C / norm[2];
		createCoordinateSystem(norm, v1, v2);
		//norm,v1,v2 factorization
		matrix = Matrix3f(norm, v1, v2).inverse();
		/*
		cerr << norm[0] << "," << norm[1] << "," << norm[2] << " ";
		cerr << v1[0] << "," << v1[1] << "," << v1[2] << " ";
		cerr << v2[0] << "," << v2[1] << "," << v2[2] << " ";
		cerr << o[0] << " " << o[1] << " " << o[2] << "\n";*/
	}